

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar48 [32];
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar47 [32];
  undefined1 auVar55 [32];
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar22 = sVar8 * uVar5;
  lVar21 = sVar8 * (uVar5 + 1);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar19 = uVar5 * sVar8;
  lVar20 = sVar8 * (uVar5 + 1);
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  aVar4 = (space->vz).field_0;
  uVar49 = *(undefined4 *)(pcVar7 + lVar22 + 8);
  auVar23._4_4_ = uVar49;
  auVar23._0_4_ = uVar49;
  auVar23._8_4_ = uVar49;
  auVar23._12_4_ = uVar49;
  auVar23 = vmulps_avx512vl((undefined1  [16])aVar4,auVar23);
  uVar49 = *(undefined4 *)(pcVar7 + lVar22 + 4);
  auVar25._4_4_ = uVar49;
  auVar25._0_4_ = uVar49;
  auVar25._8_4_ = uVar49;
  auVar25._12_4_ = uVar49;
  auVar23 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar3,auVar25);
  uVar49 = *(undefined4 *)(pcVar7 + lVar22);
  auVar27._4_4_ = uVar49;
  auVar27._0_4_ = uVar49;
  auVar27._8_4_ = uVar49;
  auVar27._12_4_ = uVar49;
  auVar24 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar2,auVar27);
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar10 = fVar1 * *(float *)(pcVar7 + lVar22 + 0xc);
  auVar46._4_4_ = fVar10;
  auVar46._0_4_ = fVar10;
  auVar46._8_4_ = fVar10;
  auVar46._12_4_ = fVar10;
  auVar47._16_4_ = fVar10;
  auVar47._0_16_ = auVar46;
  auVar47._20_4_ = fVar10;
  auVar47._24_4_ = fVar10;
  auVar47._28_4_ = fVar10;
  auVar23 = vinsertps_avx(auVar24,auVar46,0x30);
  uVar49 = *(undefined4 *)(pcVar7 + lVar21 + 8);
  auVar28._4_4_ = uVar49;
  auVar28._0_4_ = uVar49;
  auVar28._8_4_ = uVar49;
  auVar28._12_4_ = uVar49;
  auVar25 = vmulps_avx512vl((undefined1  [16])aVar4,auVar28);
  uVar49 = *(undefined4 *)(pcVar7 + lVar21 + 4);
  auVar26._4_4_ = uVar49;
  auVar26._0_4_ = uVar49;
  auVar26._8_4_ = uVar49;
  auVar26._12_4_ = uVar49;
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar3,auVar26);
  uVar49 = *(undefined4 *)(pcVar7 + lVar21);
  auVar11._4_4_ = uVar49;
  auVar11._0_4_ = uVar49;
  auVar11._8_4_ = uVar49;
  auVar11._12_4_ = uVar49;
  auVar26 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar2,auVar11);
  fVar10 = fVar1 * *(float *)(pcVar7 + lVar21 + 0xc);
  auVar54._4_4_ = fVar10;
  auVar54._0_4_ = fVar10;
  auVar54._8_4_ = fVar10;
  auVar54._12_4_ = fVar10;
  auVar55._16_4_ = fVar10;
  auVar55._0_16_ = auVar54;
  auVar55._20_4_ = fVar10;
  auVar55._24_4_ = fVar10;
  auVar55._28_4_ = fVar10;
  auVar25 = vinsertps_avx(auVar26,auVar54,0x30);
  uVar49 = *(undefined4 *)(pcVar9 + lVar19 + 8);
  auVar12._4_4_ = uVar49;
  auVar12._0_4_ = uVar49;
  auVar12._8_4_ = uVar49;
  auVar12._12_4_ = uVar49;
  auVar27 = vmulps_avx512vl((undefined1  [16])aVar4,auVar12);
  uVar49 = *(undefined4 *)(pcVar9 + lVar19 + 4);
  auVar13._4_4_ = uVar49;
  auVar13._0_4_ = uVar49;
  auVar13._8_4_ = uVar49;
  auVar13._12_4_ = uVar49;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar3,auVar13);
  uVar49 = *(undefined4 *)(pcVar9 + lVar19);
  auVar14._4_4_ = uVar49;
  auVar14._0_4_ = uVar49;
  auVar14._8_4_ = uVar49;
  auVar14._12_4_ = uVar49;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar2,auVar14);
  uVar49 = *(undefined4 *)(pcVar9 + lVar20 + 8);
  auVar15._4_4_ = uVar49;
  auVar15._0_4_ = uVar49;
  auVar15._8_4_ = uVar49;
  auVar15._12_4_ = uVar49;
  auVar28 = vmulps_avx512vl((undefined1  [16])aVar4,auVar15);
  uVar49 = *(undefined4 *)(pcVar9 + lVar20 + 4);
  auVar16._4_4_ = uVar49;
  auVar16._0_4_ = uVar49;
  auVar16._8_4_ = uVar49;
  auVar16._12_4_ = uVar49;
  auVar28 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar3,auVar16);
  uVar49 = *(undefined4 *)(pcVar9 + lVar20);
  auVar17._4_4_ = uVar49;
  auVar17._0_4_ = uVar49;
  auVar17._8_4_ = uVar49;
  auVar17._12_4_ = uVar49;
  auVar28 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar2,auVar17);
  auVar27 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar1 * *(float *)(pcVar9 + lVar19 + 0xc))),0x30);
  auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar1 * *(float *)(pcVar9 + lVar20 + 0xc))),0x30);
  auVar52._8_4_ = 0xbeaaaaab;
  auVar52._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar52._12_4_ = 0xbeaaaaab;
  auVar27 = vfnmadd213ps_fma(auVar27,auVar52,auVar23);
  auVar23 = vfmadd213ps_fma(auVar28,auVar52,auVar25);
  uVar49 = auVar24._0_4_;
  auVar57._4_4_ = uVar49;
  auVar57._0_4_ = uVar49;
  auVar57._8_4_ = uVar49;
  auVar57._12_4_ = uVar49;
  auVar57._16_4_ = uVar49;
  auVar57._20_4_ = uVar49;
  auVar57._24_4_ = uVar49;
  auVar57._28_4_ = uVar49;
  auVar33._8_4_ = 1;
  auVar33._0_8_ = 0x100000001;
  auVar33._12_4_ = 1;
  auVar33._16_4_ = 1;
  auVar33._20_4_ = 1;
  auVar33._24_4_ = 1;
  auVar33._28_4_ = 1;
  auVar44 = vpermps_avx2(auVar33,ZEXT1632(auVar24));
  auVar34._8_4_ = 2;
  auVar34._0_8_ = 0x200000002;
  auVar34._12_4_ = 2;
  auVar34._16_4_ = 2;
  auVar34._20_4_ = 2;
  auVar34._24_4_ = 2;
  auVar34._28_4_ = 2;
  auVar45 = vpermps_avx2(auVar34,ZEXT1632(auVar24));
  uVar49 = auVar27._0_4_;
  auVar60._4_4_ = uVar49;
  auVar60._0_4_ = uVar49;
  auVar60._8_4_ = uVar49;
  auVar60._12_4_ = uVar49;
  auVar60._16_4_ = uVar49;
  auVar60._20_4_ = uVar49;
  auVar60._24_4_ = uVar49;
  auVar60._28_4_ = uVar49;
  auVar43 = ZEXT1632(auVar27);
  auVar41 = vpermps_avx2(auVar33,auVar43);
  auVar42 = vpermps_avx2(auVar34,auVar43);
  auVar31._8_4_ = 3;
  auVar31._0_8_ = 0x300000003;
  auVar31._12_4_ = 3;
  auVar31._16_4_ = 3;
  auVar31._20_4_ = 3;
  auVar31._24_4_ = 3;
  auVar31._28_4_ = 3;
  auVar43 = vpermps_avx2(auVar31,auVar43);
  uVar49 = auVar23._0_4_;
  auVar61._4_4_ = uVar49;
  auVar61._0_4_ = uVar49;
  auVar61._8_4_ = uVar49;
  auVar61._12_4_ = uVar49;
  auVar61._16_4_ = uVar49;
  auVar61._20_4_ = uVar49;
  auVar61._24_4_ = uVar49;
  auVar61._28_4_ = uVar49;
  auVar40 = ZEXT1632(auVar23);
  auVar29 = vpermps_avx512vl(auVar33,auVar40);
  auVar30 = vpermps_avx512vl(auVar34,auVar40);
  auVar31 = vpermps_avx512vl(auVar31,auVar40);
  auVar32 = vbroadcastss_avx512vl(auVar26);
  auVar33 = vpermps_avx512vl(auVar33,ZEXT1632(auVar26));
  auVar40 = vpermps_avx2(auVar34,ZEXT1632(auVar26));
  auVar34 = vmulps_avx512vl(auVar32,bezier_basis0._3944_32_);
  auVar35 = vmulps_avx512vl(auVar33,bezier_basis0._3944_32_);
  auVar36._4_4_ = auVar40._4_4_ * bezier_basis0._3948_4_;
  auVar36._0_4_ = auVar40._0_4_ * bezier_basis0._3944_4_;
  auVar36._8_4_ = auVar40._8_4_ * bezier_basis0._3952_4_;
  auVar36._12_4_ = auVar40._12_4_ * bezier_basis0._3956_4_;
  auVar36._16_4_ = auVar40._16_4_ * bezier_basis0._3960_4_;
  auVar36._20_4_ = auVar40._20_4_ * bezier_basis0._3964_4_;
  auVar36._24_4_ = auVar40._24_4_ * bezier_basis0._3968_4_;
  auVar36._28_4_ = 1;
  auVar37._4_4_ = fVar10 * bezier_basis0._3948_4_;
  auVar37._0_4_ = fVar10 * bezier_basis0._3944_4_;
  auVar37._8_4_ = fVar10 * bezier_basis0._3952_4_;
  auVar37._12_4_ = fVar10 * bezier_basis0._3956_4_;
  auVar37._16_4_ = fVar10 * bezier_basis0._3960_4_;
  auVar37._20_4_ = fVar10 * bezier_basis0._3964_4_;
  auVar37._24_4_ = fVar10 * bezier_basis0._3968_4_;
  auVar37._28_4_ = bezier_basis0._3972_4_;
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2788_32_,auVar61);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2788_32_,auVar29);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2788_32_,auVar30);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar31,bezier_basis0._2788_32_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1632_32_,auVar60);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._1632_32_,auVar41);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._1632_32_,auVar42);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar43,bezier_basis0._1632_32_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._476_32_,auVar57);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._476_32_,auVar44);
  auVar38 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._476_32_,auVar45);
  auVar39 = vfmadd231ps_avx512vl(auVar37,auVar47,bezier_basis0._476_32_);
  auVar36 = vmulps_avx512vl(auVar32,bezier_basis0._8568_32_);
  auVar37 = vmulps_avx512vl(auVar33,bezier_basis0._8568_32_);
  auVar40 = vmulps_avx512vl(auVar40,bezier_basis0._8568_32_);
  auVar32 = vmulps_avx512vl(auVar55,bezier_basis0._8568_32_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._7412_32_,auVar61);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar29);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._7412_32_,auVar30);
  auVar29 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._7412_32_,auVar31);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._6256_32_,auVar60);
  auVar41 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._6256_32_,auVar41);
  auVar42 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._6256_32_,auVar42);
  auVar43 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._6256_32_,auVar43);
  auVar40 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._5100_32_,auVar57);
  auVar44 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._5100_32_,auVar44);
  auVar23 = vfmadd231ps_fma(auVar42,bezier_basis0._5100_32_,auVar45);
  auVar41._8_4_ = 0x3d638e39;
  auVar41._0_8_ = 0x3d638e393d638e39;
  auVar41._12_4_ = 0x3d638e39;
  auVar41._16_4_ = 0x3d638e39;
  auVar41._20_4_ = 0x3d638e39;
  auVar41._24_4_ = 0x3d638e39;
  auVar41._28_4_ = 0x3d638e39;
  auVar25 = vfmadd231ps_fma(auVar43,bezier_basis0._5100_32_,auVar47);
  auVar30 = vmulps_avx512vl(auVar40,auVar41);
  auVar31 = vmulps_avx512vl(auVar44,auVar41);
  auVar29._28_4_ = auVar45._28_4_;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar23._12_4_ * 0.055555556,
                          CONCAT48(auVar23._8_4_ * 0.055555556,
                                   CONCAT44(auVar23._4_4_ * 0.055555556,auVar23._0_4_ * 0.055555556)
                                  )));
  auVar32 = ZEXT1632(CONCAT412(auVar25._12_4_ * 0.055555556,
                               CONCAT48(auVar25._8_4_ * 0.055555556,
                                        CONCAT44(auVar25._4_4_ * 0.055555556,
                                                 auVar25._0_4_ * 0.055555556))));
  auVar18 = ZEXT812(0);
  auVar44 = vblendps_avx(auVar30,ZEXT1232(auVar18) << 0x20,1);
  auVar45 = vblendps_avx(auVar31,ZEXT1232(auVar18) << 0x20,1);
  auVar33 = ZEXT1232(auVar18) << 0x20;
  auVar41 = vblendps_avx(auVar29,auVar33,1);
  auVar42 = vblendps_avx(auVar32,auVar33,1);
  auVar43 = vsubps_avx(auVar34,auVar44);
  auVar40 = vsubps_avx(auVar35,auVar45);
  auVar36 = vsubps_avx(auVar38,auVar41);
  auVar37 = vsubps_avx(auVar39,auVar42);
  auVar44 = vblendps_avx(auVar30,auVar33,0x80);
  auVar45 = vblendps_avx(auVar31,auVar33,0x80);
  auVar41 = vblendps_avx(auVar29,ZEXT1232(auVar18) << 0x20,0x80);
  auVar42 = vblendps_avx(auVar32,ZEXT1232(auVar18) << 0x20,0x80);
  auVar48._0_4_ = auVar34._0_4_ + auVar44._0_4_;
  auVar48._4_4_ = auVar34._4_4_ + auVar44._4_4_;
  auVar48._8_4_ = auVar34._8_4_ + auVar44._8_4_;
  auVar48._12_4_ = auVar34._12_4_ + auVar44._12_4_;
  auVar48._16_4_ = auVar34._16_4_ + auVar44._16_4_;
  auVar48._20_4_ = auVar34._20_4_ + auVar44._20_4_;
  auVar48._24_4_ = auVar34._24_4_ + auVar44._24_4_;
  auVar48._28_4_ = auVar34._28_4_ + auVar44._28_4_;
  auVar58._0_4_ = auVar35._0_4_ + auVar45._0_4_;
  auVar58._4_4_ = auVar35._4_4_ + auVar45._4_4_;
  auVar58._8_4_ = auVar35._8_4_ + auVar45._8_4_;
  auVar58._12_4_ = auVar35._12_4_ + auVar45._12_4_;
  auVar58._16_4_ = auVar35._16_4_ + auVar45._16_4_;
  auVar58._20_4_ = auVar35._20_4_ + auVar45._20_4_;
  auVar58._24_4_ = auVar35._24_4_ + auVar45._24_4_;
  auVar58._28_4_ = auVar35._28_4_ + auVar45._28_4_;
  auVar59._0_4_ = auVar41._0_4_ + auVar38._0_4_;
  auVar59._4_4_ = auVar41._4_4_ + auVar38._4_4_;
  auVar59._8_4_ = auVar41._8_4_ + auVar38._8_4_;
  auVar59._12_4_ = auVar41._12_4_ + auVar38._12_4_;
  auVar59._16_4_ = auVar41._16_4_ + auVar38._16_4_;
  auVar59._20_4_ = auVar41._20_4_ + auVar38._20_4_;
  auVar59._24_4_ = auVar41._24_4_ + auVar38._24_4_;
  auVar59._28_4_ = auVar41._28_4_ + auVar38._28_4_;
  auVar56._0_4_ = auVar39._0_4_ + auVar42._0_4_;
  auVar56._4_4_ = auVar39._4_4_ + auVar42._4_4_;
  auVar56._8_4_ = auVar39._8_4_ + auVar42._8_4_;
  auVar56._12_4_ = auVar39._12_4_ + auVar42._12_4_;
  auVar56._16_4_ = auVar39._16_4_ + auVar42._16_4_;
  auVar56._20_4_ = auVar39._20_4_ + auVar42._20_4_;
  auVar56._24_4_ = auVar39._24_4_ + auVar42._24_4_;
  auVar56._28_4_ = auVar39._28_4_ + auVar42._28_4_;
  auVar42._8_4_ = 0x7f800000;
  auVar42._0_8_ = 0x7f8000007f800000;
  auVar42._12_4_ = 0x7f800000;
  auVar42._16_4_ = 0x7f800000;
  auVar42._20_4_ = 0x7f800000;
  auVar42._24_4_ = 0x7f800000;
  auVar42._28_4_ = 0x7f800000;
  auVar44 = vminps_avx(auVar42,auVar34);
  auVar45 = vminps_avx(auVar42,auVar35);
  auVar41 = vminps_avx(auVar42,auVar38);
  auVar42 = vminps_avx(auVar42,auVar39);
  auVar29 = vminps_avx512vl(auVar43,auVar48);
  auVar29 = vminps_avx512vl(auVar44,auVar29);
  auVar44 = vminps_avx512vl(auVar40,auVar58);
  auVar30 = vminps_avx512vl(auVar45,auVar44);
  auVar44 = vminps_avx512vl(auVar36,auVar59);
  auVar31 = vminps_avx512vl(auVar41,auVar44);
  auVar44 = vminps_avx512vl(auVar37,auVar56);
  auVar32 = vminps_avx512vl(auVar42,auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar45 = vmaxps_avx512vl(auVar44,auVar34);
  auVar41 = vmaxps_avx512vl(auVar44,auVar35);
  auVar42 = vmaxps_avx512vl(auVar44,auVar38);
  auVar33 = vmaxps_avx512vl(auVar44,auVar39);
  auVar44 = vmaxps_avx(auVar43,auVar48);
  auVar44 = vmaxps_avx(auVar45,auVar44);
  auVar45 = vmaxps_avx(auVar40,auVar58);
  auVar45 = vmaxps_avx(auVar41,auVar45);
  auVar41 = vmaxps_avx(auVar36,auVar59);
  auVar41 = vmaxps_avx(auVar42,auVar41);
  auVar42 = vmaxps_avx(auVar37,auVar56);
  auVar42 = vmaxps_avx(auVar33,auVar42);
  auVar43 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar43 = vminps_avx(auVar29,auVar43);
  auVar40 = vshufpd_avx(auVar43,auVar43,5);
  auVar43 = vminps_avx(auVar43,auVar40);
  auVar23 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
  auVar43 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar43 = vminps_avx(auVar30,auVar43);
  auVar40 = vshufpd_avx(auVar43,auVar43,5);
  auVar43 = vminps_avx(auVar43,auVar40);
  auVar25 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
  auVar25 = vunpcklps_avx(auVar23,auVar25);
  auVar43 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar43 = vminps_avx(auVar31,auVar43);
  auVar40 = vshufpd_avx(auVar43,auVar43,5);
  auVar43 = vminps_avx(auVar43,auVar40);
  auVar23 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
  auVar27 = vinsertps_avx(auVar25,auVar23,0x28);
  auVar43 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar44 = vmaxps_avx(auVar44,auVar43);
  auVar43 = vshufpd_avx(auVar44,auVar44,5);
  auVar44 = vmaxps_avx(auVar44,auVar43);
  auVar23 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
  auVar44 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar44 = vmaxps_avx(auVar45,auVar44);
  auVar45 = vshufpd_avx(auVar44,auVar44,5);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar25 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
  auVar25 = vunpcklps_avx(auVar23,auVar25);
  auVar44 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar44 = vmaxps_avx(auVar41,auVar44);
  auVar45 = vshufpd_avx(auVar44,auVar44,5);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar23 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
  auVar28 = vinsertps_avx(auVar25,auVar23,0x28);
  auVar44 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar44 = vminps_avx(auVar32,auVar44);
  auVar45 = vshufpd_avx(auVar44,auVar44,5);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar23 = vminss_avx(auVar44._0_16_,auVar44._16_16_);
  auVar44 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar44 = vmaxps_avx(auVar42,auVar44);
  auVar45 = vshufpd_avx(auVar44,auVar44,5);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar25 = vmaxss_avx(auVar44._0_16_,auVar44._16_16_);
  auVar53._8_4_ = 0x7fffffff;
  auVar53._0_8_ = 0x7fffffff7fffffff;
  auVar53._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx(auVar23,auVar53);
  auVar25 = vandps_avx(auVar25,auVar53);
  auVar23 = vmaxss_avx(auVar25,auVar23);
  auVar50._0_4_ = auVar23._0_4_;
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_4_ = auVar50._0_4_;
  auVar50._12_4_ = auVar50._0_4_;
  auVar27 = vsubps_avx(auVar27,auVar50);
  auVar24._0_4_ = auVar28._0_4_ + auVar50._0_4_;
  auVar24._4_4_ = auVar28._4_4_ + auVar50._0_4_;
  auVar24._8_4_ = auVar28._8_4_ + auVar50._0_4_;
  auVar24._12_4_ = auVar28._12_4_ + auVar50._0_4_;
  auVar23 = vandps_avx(auVar27,auVar53);
  auVar25 = vandps_avx(auVar24,auVar53);
  auVar23 = vmaxps_avx(auVar23,auVar25);
  auVar25 = vmovshdup_avx(auVar23);
  auVar25 = vmaxss_avx(auVar25,auVar23);
  auVar23 = vshufpd_avx(auVar23,auVar23,1);
  auVar23 = vmaxss_avx(auVar23,auVar25);
  fVar1 = auVar23._0_4_ * 4.7683716e-07;
  auVar51._4_4_ = fVar1;
  auVar51._0_4_ = fVar1;
  auVar51._8_4_ = fVar1;
  auVar51._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar27,auVar51);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar24._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar24._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar24._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar24._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }